

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O1

void __thiscall
re2::DFA::RunWorkqOnByte(DFA *this,Workq *oldq,Workq *newq,int c,uint32_t flag,bool *ismatch)

{
  int iVar1;
  MatchKind MVar2;
  Inst *pIVar3;
  uint uVar4;
  int *piVar5;
  LogMessage local_1b0;
  
  (newq->super_SparseSet).size_ = 0;
  newq->nextmark_ = newq->n_;
  if ((oldq->super_SparseSet).size_ != 0) {
    piVar5 = ((_Head_base<0UL,_int_*,_false> *)
             ((long)&(oldq->super_SparseSet).dense_.ptr_._M_t.
                     super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                     super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter> + 8))->_M_head_impl;
    do {
      iVar1 = *piVar5;
      if (iVar1 < oldq->n_) {
        pIVar3 = ((_Head_base<0UL,_re2::Prog::Inst_*,_false> *)
                 ((long)&(this->prog_->inst_).ptr_._M_t.
                         super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>
                         ._M_t.
                         super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                 + 8))->_M_head_impl;
        switch(pIVar3[iVar1].out_opcode_ & 7) {
        case 0:
          LogMessage::LogMessage
                    (&local_1b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/dfa.cc"
                     ,0x3c3);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b0.str_,"unhandled opcode: ",0x12);
          std::ostream::operator<<((ostream *)&local_1b0.str_,pIVar3[iVar1].out_opcode_ & 7);
          LogMessage::~LogMessage(&local_1b0);
          break;
        case 2:
          uVar4 = c;
          if ((pIVar3[iVar1].field_1.out1_ & 0x10000) != 0) {
            uVar4 = c | 0x20;
          }
          if (0x19 < c - 0x41U) {
            uVar4 = c;
          }
          if (((int)(uint)pIVar3[iVar1].field_1.field_3.lo_ <= (int)uVar4) &&
             ((int)uVar4 <= (int)(uint)pIVar3[iVar1].field_1.field_3.hi_)) {
            AddToQueue(this,newq,pIVar3[iVar1].out_opcode_ >> 4,flag);
          }
          break;
        case 5:
          MVar2 = this->kind_;
          if (((c != 0x100 & this->prog_->anchor_end_ & MVar2 != kManyMatch) == 0) &&
             (*ismatch = true, MVar2 == kFirstMatch)) {
            return;
          }
        }
      }
      else {
        if (*ismatch != false) {
          return;
        }
        if (newq->last_was_mark_ == false) {
          newq->last_was_mark_ = false;
          iVar1 = newq->nextmark_;
          newq->nextmark_ = iVar1 + 1;
          SparseSetT<void>::InsertInternal(&newq->super_SparseSet,false,iVar1);
        }
      }
      piVar5 = piVar5 + 1;
    } while (piVar5 != ((_Head_base<0UL,_int_*,_false> *)
                       ((long)&(oldq->super_SparseSet).dense_.ptr_._M_t.
                               super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                               super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter> + 8))->
                       _M_head_impl + (oldq->super_SparseSet).size_);
  }
  return;
}

Assistant:

void DFA::RunWorkqOnByte(Workq* oldq, Workq* newq,
                         int c, uint32_t flag, bool* ismatch) {
  //mutex_.AssertHeld();

  newq->clear();
  for (Workq::iterator i = oldq->begin(); i != oldq->end(); ++i) {
    if (oldq->is_mark(*i)) {
      if (*ismatch)
        return;
      newq->mark();
      continue;
    }
    int id = *i;
    Prog::Inst* ip = prog_->inst(id);
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "unhandled opcode: " << ip->opcode();
        break;

      case kInstFail:        // never succeeds
      case kInstCapture:     // already followed
      case kInstNop:         // already followed
      case kInstAltMatch:    // already followed
      case kInstEmptyWidth:  // already followed
        break;

      case kInstByteRange:   // can follow if c is in range
        if (ip->Matches(c))
          AddToQueue(newq, ip->out(), flag);
        break;

      case kInstMatch:
        if (prog_->anchor_end() && c != kByteEndText &&
            kind_ != Prog::kManyMatch)
          break;
        *ismatch = true;
        if (kind_ == Prog::kFirstMatch) {
          // Can stop processing work queue since we found a match.
          return;
        }
        break;
    }
  }

  if (ExtraDebug)
    fprintf(stderr, "%s on %d[%#x] -> %s [%d]\n", DumpWorkq(oldq).c_str(),
            c, flag, DumpWorkq(newq).c_str(), *ismatch);
}